

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

bool __thiscall Clasp::DefaultMinimize::integrateBound(DefaultMinimize *this,Solver *s)

{
  undefined1 *puVar1;
  size_type sVar2;
  uint uVar3;
  SharedData *pSVar4;
  SharedMinimizeData *this_00;
  wsum_t *pwVar5;
  long lVar6;
  bool bVar7;
  uint32 uVar8;
  ulong uVar9;
  uint32 uVar10;
  bool bVar11;
  uint32 x;
  WeightLiteral min;
  uint32 local_3c;
  WeightLiteral local_38;
  
  pSVar4 = (this->super_MinimizeConstraint).shared_;
  if (pSVar4->optGen_ == 0) {
    if (pSVar4->mode_ != enumerate) goto LAB_001510fc;
LAB_00151119:
    bVar11 = false;
LAB_0015111b:
    bVar7 = MinimizeConstraint::prepare(&this->super_MinimizeConstraint,s,bVar11);
    if (!bVar7) {
      return false;
    }
    if (bVar11 == false) goto LAB_00151174;
  }
  else {
    if ((pSVar4->mode_ == enumerate) ||
       ((pSVar4->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar4->optGen_))
    goto LAB_00151119;
LAB_001510fc:
    if (*(uint *)&(this->step_).field_0x4 < 0x40000000) {
      bVar11 = ((this->super_MinimizeConstraint).shared_)->mode_ == enumOpt;
      goto LAB_0015111b;
    }
    bVar11 = MinimizeConstraint::prepare(&this->super_MinimizeConstraint,s,true);
    if (!bVar11) {
      return false;
    }
  }
  if (*(uint *)((long)(s->assign_).assign_.ebo_.buf +
               (ulong)((this->super_MinimizeConstraint).tag_.rep_ & 0xfffffffc)) < 0x10) {
    puVar1 = &(this->step_).field_0x7;
    *puVar1 = *puVar1 & 0x3f;
    stepInit(this,0);
  }
LAB_00151174:
  if ((*this->bounds_ != 0x7fffffffffffffff) &&
     ((pSVar4 = (this->super_MinimizeConstraint).shared_, pSVar4->mode_ == enumerate ||
      ((pSVar4->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar4->optGen_)))) {
    return (s->conflict_).ebo_.size == 0;
  }
  sVar2 = (((this->super_MinimizeConstraint).shared_)->weights).ebo_.size;
  local_38.second = sVar2 - 1;
  if (sVar2 == 0) {
    local_38.second = 0;
  }
  local_38.first.rep_ = 0;
  if ((s->conflict_).ebo_.size == 0) {
    while( true ) {
      pSVar4 = (this->super_MinimizeConstraint).shared_;
      if (pSVar4->mode_ == enumerate) {
        bVar11 = false;
      }
      else {
        bVar11 = (pSVar4->gCount_).super___atomic_base<unsigned_int>._M_i != pSVar4->optGen_;
      }
      bVar11 = updateBounds(this,bVar11);
      if (!bVar11) break;
      local_3c = 0;
      uVar10 = (s->levels_).super_type.ebo_.size + 1;
      this_00 = (this->super_MinimizeConstraint).shared_;
      pwVar5 = this->bounds_;
      if ((this_00->weights).ebo_.size == 0) {
        if (*pwVar5 < (long)local_38.second + pwVar5[this->size_]) goto LAB_0015128c;
LAB_001512a9:
        while (((s->conflict_).ebo_.size == 0 || (bVar11 = Solver::resolveConflict(s), bVar11))) {
          uVar8 = Solver::undoUntil(s,uVar10 - 1,1);
          if (uVar10 - 1 < uVar8) {
            Solver::backtrack(s);
          }
          else {
            bVar11 = propagateImpl(this,s,propagate_new_opt);
            if (bVar11) {
              return true;
            }
          }
        }
      }
      else {
        bVar11 = SharedMinimizeData::imp
                           (this_00,pwVar5 + this->size_,
                            (this_00->weights).ebo_.buf + (uint)local_38.second,pwVar5,
                            &this->actLev_);
        if (!bVar11) goto LAB_001512a9;
LAB_0015128c:
        uVar10 = computeImplicationSet(this,s,&local_38,&local_3c);
        if ((s->levels_).root < uVar10) goto LAB_001512a9;
      }
      pSVar4 = (this->super_MinimizeConstraint).shared_;
      if ((pSVar4->mode_ == enumerate) ||
         ((pSVar4->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar4->optGen_)) break;
      uVar3 = *(uint *)&(this->step_).field_0x4;
      if ((ulong)uVar3 < 0x40000000) {
        *(uint *)&(this->step_).field_0x4 = uVar3 + 1 & 0x3fffffff;
      }
      else {
        pwVar5 = this->bounds_;
        uVar9 = (ulong)uVar3 & 0x3fffffff;
        lVar6 = pwVar5[uVar9];
        pwVar5[uVar9] = lVar6 + 1;
        pwVar5[(ulong)(this->size_ * 3) + ((ulong)*(uint *)&(this->step_).field_0x4 & 0x3fffffff)] =
             lVar6 + 1;
      }
      if ((s->conflict_).ebo_.size != 0) break;
    }
  }
  relaxBound(this,false);
  if ((s->conflict_).ebo_.size == 0) {
    Solver::undoUntilImpl(s,0,false);
    Solver::setStopConflict(s);
    return false;
  }
  return false;
}

Assistant:

bool DefaultMinimize::integrateBound(Solver& s) {
	bool useTag = shared_->optimize() && (step_.type != 0 || shared_->mode() == MinimizeMode_t::enumOpt);
	if (!prepare(s, useTag)) { return false; }
	if (useTag && s.level(tag_.var()) == 0) {
		step_.type = 0;
		stepInit(0);
	}
	if ((active() && !shared_->checkNext())) { return !s.hasConflict(); }
	WeightLiteral min(lit_true(), shared_->weights.empty() ? uint32(0) : (uint32)shared_->weights.size()-1);
	while (!s.hasConflict() && updateBounds(shared_->checkNext())) {
		uint32 x = 0;
		uint32 dl= s.decisionLevel() + 1;
		if (!STRATEGY(imp(sum(), min, opt(), actLev_)) || (dl = computeImplicationSet(s, min, x)) > s.rootLevel()) {
			for (--dl; !s.hasConflict() || s.resolveConflict(); ) {
				if      (s.undoUntil(dl, Solver::undo_pop_bt_level) > dl){ s.backtrack(); }
				else if (propagateImpl(s, propagate_new_opt))            { return true;   }
			}
		}
		if (!shared_->checkNext()) {
			break;
		}
		if (!step_.type) { ++step_.lev; }
		else             { stepLow() = ++opt()[step_.lev]; }
	}
	relaxBound(false);
	if (!s.hasConflict()) {
		s.undoUntil(0);
		s.setStopConflict();
	}
	return false;
}